

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O1

void Uint64ToByteArray(UINT64 i,BYTE *a)

{
  *(UINT64 *)a = i >> 0x38 | (i & 0xff000000000000) >> 0x28 | (i & 0xff0000000000) >> 0x18 |
                 (i & 0xff00000000) >> 8 | (i & 0xff000000) << 8 | (i & 0xff0000) << 0x18 |
                 (i & 0xff00) << 0x28 | i << 0x38;
  return;
}

Assistant:

void
Uint64ToByteArray(
    UINT64               i,
    BYTE                *a
    )
{
    a[7] = (BYTE)(i); i >>= 8;
    a[6] = (BYTE)(i); i >>= 8;
    a[5] = (BYTE)(i); i >>= 8;
    a[4] = (BYTE)(i); i >>= 8;
    a[3] = (BYTE)(i); i >>= 8;
    a[2] = (BYTE)(i); i >>= 8;
    a[1] = (BYTE)(i); i >>= 8;
    a[0] = (BYTE)(i);
}